

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scripting.cpp
# Opt level: O0

void scripting_interface::scripting_trace_log_parameter_printer
               (Scripting *scripting,ScriptingHandle replay,ScriptingHandle report_writer)

{
  HSQUIRRELVM *ppSVar1;
  SQInteger newtop;
  SQRESULT SVar2;
  HSQOBJECT obj;
  HSQOBJECT obj_00;
  bool success;
  SQInteger top;
  HSQUIRRELVM *v;
  ScriptingHandle report_writer_local;
  ScriptingHandle replay_local;
  Scripting *scripting_local;
  
  ppSVar1 = &scripting->v;
  newtop = sq_gettop(*ppSVar1);
  sq_pushroottable(*ppSVar1);
  sq_pushstring(*ppSVar1,"trace_log_parameter_printer",-1);
  SVar2 = sq_get(*ppSVar1,-2);
  if (SVar2 < 0) {
    printf("trace_log_parameter_printer not found in script!");
  }
  else {
    sq_pushroottable(*ppSVar1);
    obj._0_8_ = *replay & 0xffffffff;
    obj._unVal.pTable = ((SQObjectValue *)((long)replay + 8))->pTable;
    sq_pushobject(*ppSVar1,obj);
    obj_00._0_8_ = *report_writer & 0xffffffff;
    obj_00._unVal.pTable = ((SQObjectValue *)((long)report_writer + 8))->pTable;
    sq_pushobject(*ppSVar1,obj_00);
    sq_call(*ppSVar1,3,1,1);
    sq_pop(*ppSVar1,1);
  }
  sq_settop(*ppSVar1,newtop);
  return;
}

Assistant:

void scripting_trace_log_parameter_printer(Scripting *scripting, ScriptingHandle replay, ScriptingHandle report_writer) {
		HSQUIRRELVM &v = scripting->v;
		SQInteger top = sq_gettop(v);
		sq_pushroottable(v);
		sq_pushstring(v, _SC("trace_log_parameter_printer"), -1);
		bool success = SQ_SUCCEEDED(sq_get(v, -2));
		if (success) {
			sq_pushroottable(v);
			sq_pushobject(v, *(HSQOBJECT*)replay);
			sq_pushobject(v, *(HSQOBJECT*)report_writer);
			sq_call(v, 3, SQTrue, SQTrue);
			sq_pop(v, 1);
		}
		else {
			printf("trace_log_parameter_printer not found in script!");
		}
		sq_settop(v, top);
	}